

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

bool __thiscall QPDFParser::tooManyBadTokens(QPDFParser *this)

{
  int iVar1;
  int iVar2;
  StackFrame *pSVar3;
  bool bVar4;
  qpdf_offset_t qVar5;
  string local_30;
  
  pSVar3 = this->frame;
  if (((ulong)((long)(pSVar3->olist).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(pSVar3->olist).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start) < 0x13881) &&
     ((pSVar3->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x1389)) {
    iVar1 = this->max_bad_count;
    this->max_bad_count = iVar1 + -1;
    if ((iVar1 < 2) || (this->good_count < 5)) {
      iVar2 = this->bad_count;
      this->bad_count = iVar2 + 1;
      if (4 < iVar2) {
LAB_001e04b0:
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_30,"too many errors; giving up on reading object","");
        qVar5 = InputSource::getLastOffset(this->input);
        warn(this,qVar5,&local_30);
        goto LAB_001e045d;
      }
      if (pSVar3->state != st_array) {
        if (iVar1 < 1) {
          QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar1 + -1);
        }
        if ((ulong)(long)this->max_bad_count <
            (ulong)((long)(this->frame->olist).
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->frame->olist).
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4)) goto LAB_001e04b0;
      }
      this->good_count = 0;
    }
    else {
      this->good_count = 0;
      this->bad_count = 1;
    }
    bVar4 = false;
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "encountered errors while parsing an array or dictionary with more than 5000 elements; giving up on reading object"
               ,"");
    qVar5 = InputSource::getLastOffset(this->input);
    warn(this,qVar5,&local_30);
LAB_001e045d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool
QPDFParser::tooManyBadTokens()
{
    if (frame->olist.size() > 5'000 || frame->dict.size() > 5'000) {
        warn(
            "encountered errors while parsing an array or dictionary with more than 5000 "
            "elements; giving up on reading object");
        return true;
    }
    if (--max_bad_count > 0 && good_count > 4) {
        good_count = 0;
        bad_count = 1;
        return false;
    }
    if (++bad_count > 5 ||
        (frame->state != st_array && QIntC::to_size(max_bad_count) < frame->olist.size())) {
        // Give up after 5 errors in close proximity or if the number of missing dictionary keys
        // exceeds the remaining number of allowable total errors.
        warn("too many errors; giving up on reading object");
        return true;
    }
    good_count = 0;
    return false;
}